

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void run_every_test(TestSuite *suite,TestReporter *reporter)

{
  _func_void_TestReporter_ptr_char_ptr_int *p_Var1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t end_time_in_milliseconds;
  char *pcVar5;
  TestReporter *in_RSI;
  TestSuite *in_RDI;
  uint32_t test_starting_milliseconds;
  uint32_t total_test_starting_milliseconds;
  int i;
  TestReporter *in_stack_00000050;
  CgreenTest *in_stack_00000058;
  TestSuite *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  TestSuite *suite_00;
  TestReporter *suite_01;
  
  run_specified_test_if_child(in_RDI,in_RSI);
  uVar2 = cgreen_time_get_current_milliseconds();
  p_Var1 = in_RSI->start_suite;
  suite_00 = (TestSuite *)in_RDI->name;
  suite_01 = in_RSI;
  iVar3 = count_tests((TestSuite *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  (*p_Var1)(in_RSI,(char *)suite_00,iVar3);
  for (iVar3 = 0; iVar3 < in_RDI->size; iVar3 = iVar3 + 1) {
    if (in_RDI->tests[iVar3].type != 0) {
      (*in_RDI->setup)();
      run_every_test((TestSuite *)suite_01,(TestReporter *)CONCAT44(iVar3,uVar2));
      (*in_RDI->teardown)();
    }
  }
  suite_01->passes = 0;
  suite_01->failures = 0;
  suite_01->skips = 0;
  suite_01->exceptions = 0;
  uVar4 = cgreen_time_get_current_milliseconds();
  for (iVar3 = 0; iVar3 < in_RDI->size; iVar3 = iVar3 + 1) {
    if (in_RDI->tests[iVar3].type == 0) {
      pcVar5 = getenv("CGREEN_NO_FORK");
      if (pcVar5 == (char *)0x0) {
        run_test_in_its_own_process(in_stack_00000060,in_stack_00000058,in_stack_00000050);
      }
      else {
        run_test_in_the_current_process
                  (suite_00,(CgreenTest *)in_RSI,
                   (TestReporter *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
    }
  }
  end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
  uVar4 = cgreen_time_duration_in_milliseconds(uVar4,end_time_in_milliseconds);
  suite_01->duration = uVar4;
  uVar4 = cgreen_time_get_current_milliseconds();
  uVar2 = cgreen_time_duration_in_milliseconds(uVar2,uVar4);
  suite_01->total_duration = uVar2;
  send_reporter_completion_notification((TestReporter *)0x10fa7d);
  (*suite_01->finish_suite)(suite_01,in_RDI->filename,in_RDI->line);
  return;
}

Assistant:

static void run_every_test(TestSuite *suite, TestReporter *reporter)
{
    int i;

    run_specified_test_if_child(suite, reporter);

    uint32_t total_test_starting_milliseconds = cgreen_time_get_current_milliseconds();
    (*reporter->start_suite)(reporter, suite->name, count_tests(suite));

    // Run sub-suites first
    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type != test_function)
        {
            (*suite->setup)();
            run_every_test(suite->tests[i].Runnable.suite, reporter);
            (*suite->teardown)();
        }
    }

    // Reset counters for top-level tests
    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    // Run top-level tests
    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type == test_function)
        {
            if (getenv("CGREEN_NO_FORK") == NULL)
                run_test_in_its_own_process(suite, suite->tests[i].Runnable.test, reporter);
            else
                run_test_in_the_current_process(suite, suite->tests[i].Runnable.test, reporter);
        }
    }

    reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                              cgreen_time_get_current_milliseconds());
    reporter->total_duration = cgreen_time_duration_in_milliseconds(total_test_starting_milliseconds,
                                                                    cgreen_time_get_current_milliseconds());
    send_reporter_completion_notification(reporter);
    (*reporter->finish_suite)(reporter, suite->filename, suite->line);
}